

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::SetColumnCommentInfo::Deserialize(SetColumnCommentInfo *this,Deserializer *deserializer)

{
  SetColumnCommentInfo *this_00;
  pointer pSVar1;
  _Head_base<0UL,_duckdb::SetColumnCommentInfo_*,_false> local_20;
  
  this_00 = (SetColumnCommentInfo *)operator_new(0xd8);
  SetColumnCommentInfo(this_00);
  local_20._M_head_impl = this_00;
  pSVar1 = unique_ptr<duckdb::SetColumnCommentInfo,_std::default_delete<duckdb::SetColumnCommentInfo>,_true>
           ::operator->((unique_ptr<duckdb::SetColumnCommentInfo,_std::default_delete<duckdb::SetColumnCommentInfo>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<duckdb::CatalogType>
            (deserializer,300,"catalog_entry_type",&(pSVar1->super_AlterInfo).field_0x71);
  pSVar1 = unique_ptr<duckdb::SetColumnCommentInfo,_std::default_delete<duckdb::SetColumnCommentInfo>,_true>
           ::operator->((unique_ptr<duckdb::SetColumnCommentInfo,_std::default_delete<duckdb::SetColumnCommentInfo>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<duckdb::Value>
            (deserializer,0x12d,"comment_value",&pSVar1->comment_value);
  pSVar1 = unique_ptr<duckdb::SetColumnCommentInfo,_std::default_delete<duckdb::SetColumnCommentInfo>,_true>
           ::operator->((unique_ptr<duckdb::SetColumnCommentInfo,_std::default_delete<duckdb::SetColumnCommentInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0x12e,"column_name",&pSVar1->column_name);
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> SetColumnCommentInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SetColumnCommentInfo>(new SetColumnCommentInfo());
	deserializer.ReadProperty<CatalogType>(300, "catalog_entry_type", result->catalog_entry_type);
	deserializer.ReadProperty<Value>(301, "comment_value", result->comment_value);
	deserializer.ReadPropertyWithDefault<string>(302, "column_name", result->column_name);
	return std::move(result);
}